

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-embed.c
# Opt level: O3

int run_test_embed(void)

{
  int iVar1;
  undefined8 uVar2;
  uv_loop_t external;
  undefined1 local_360 [848];
  
  iVar1 = uv_loop_init(local_360);
  if (iVar1 == 0) {
    embed_timer_called = 0;
    embed_closed = 0;
    uv_async_init(local_360,&embed_async,embed_cb);
    uVar2 = uv_default_loop();
    uv_timer_init(uVar2,&embed_timer);
    uv_timer_start(&embed_timer,embed_timer_cb,0xfa,0);
    uv_sem_init(&embed_sem,0);
    uv_thread_create(&embed_thread,embed_thread_runner,0);
    uv_run(local_360,0);
    uv_thread_join(&embed_thread);
    uv_loop_close(local_360);
    if (embed_timer_called == 1) {
      return 0;
    }
  }
  else {
    run_test_embed_cold_1();
  }
  run_test_embed_cold_2();
  uVar2 = uv_default_loop();
  uv_run(uVar2,1);
  iVar1 = uv_sem_post(&embed_sem);
  return iVar1;
}

Assistant:

TEST_IMPL(embed) {
#if defined(HAVE_KQUEUE) || defined(HAVE_EPOLL)
  uv_loop_t external;

  ASSERT(0 == uv_loop_init(&external));

  embed_timer_called = 0;
  embed_closed = 0;

  uv_async_init(&external, &embed_async, embed_cb);

  /* Start timer in default loop */
  uv_timer_init(uv_default_loop(), &embed_timer);
  uv_timer_start(&embed_timer, embed_timer_cb, 250, 0);

  /* Start worker that will interrupt external loop */
  uv_sem_init(&embed_sem, 0);
  uv_thread_create(&embed_thread, embed_thread_runner, NULL);

  /* But run external loop */
  uv_run(&external, UV_RUN_DEFAULT);

  uv_thread_join(&embed_thread);
  uv_loop_close(&external);

  ASSERT(embed_timer_called == 1);
#endif

  return 0;
}